

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O1

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateArrayedI32Vec
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,uint32_t num_components,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag)

{
  bool bVar1;
  spv_result_t sVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Instruction *pIVar5;
  ostream *poVar6;
  long *plVar7;
  Instruction *inst_00;
  size_type *psVar8;
  long lVar9;
  char *pcVar10;
  uint32_t underlying_type;
  ostringstream ss;
  string local_1d0;
  uint32_t local_1b0;
  undefined1 local_1ac [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  inst_00 = (Instruction *)local_1ac;
  local_1ac = (undefined1  [4])0x0;
  sVar2 = GetUnderlyingType(this->_,decoration,inst,(uint32_t *)inst_00);
  if (sVar2 == SPV_SUCCESS) {
    pIVar5 = ValidationState_t::FindDef(this->_,(uint32_t)local_1ac);
    if ((pIVar5->inst_).opcode == 0x1c) {
      uVar4 = (pIVar5->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[2];
      bVar1 = ValidationState_t::IsIntVectorType(this->_,uVar4);
      if (bVar1) {
        local_1b0 = ValidationState_t::GetDimension(this->_,uVar4);
        uVar3 = ValidationState_t::GetDimension(this->_,uVar4);
        if (uVar3 == num_components) {
          uVar4 = ValidationState_t::GetBitWidth(this->_,uVar4);
          if (uVar4 == 0x20) {
            return SPV_SUCCESS;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1ac + 4));
          (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                    (&local_1d0,decoration,(Decoration *)inst,inst_00);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)(local_1ac + 4),local_1d0._M_dataplus._M_p,
                              local_1d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," has components with bit width ",0x1f);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          pcVar10 = ".";
          lVar9 = 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1ac + 4));
          (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                    (&local_1d0,decoration,(Decoration *)inst,inst_00);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)(local_1ac + 4),local_1d0._M_dataplus._M_p,
                              local_1d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," has ",5);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          pcVar10 = " components.";
          lVar9 = 0xc;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar10,lVar9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        if ((diag->super__Function_base)._M_manager != (_Manager_type)0x0) {
          sVar2 = (*diag->_M_invoker)((_Any_data *)diag,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1ac + 4));
          std::ios_base::~ios_base(local_138);
          return sVar2;
        }
        goto LAB_001a94b8;
      }
      (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                (&local_1d0,decoration,(Decoration *)inst,inst_00);
    }
    else {
      (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                (&local_1d0,decoration,(Decoration *)inst,inst_00);
    }
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_1d0);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_1a8[0].field_2._0_8_ = *psVar8;
      local_1a8[0].field_2._8_4_ = (undefined4)plVar7[3];
      local_1a8[0].field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    }
    else {
      local_1a8[0].field_2._0_8_ = *psVar8;
      local_1a8[0]._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_1a8[0]._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((diag->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_001a94b8:
      std::__throw_bad_function_call();
    }
    sVar2 = (*diag->_M_invoker)((_Any_data *)diag,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(local_1ac + 4));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
  }
  return sVar2;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateArrayedI32Vec(
    const Decoration& decoration, const Instruction& inst,
    uint32_t num_components,
    const std::function<spv_result_t(const std::string& message)>& diag) {
  uint32_t underlying_type = 0;
  if (spv_result_t error =
          GetUnderlyingType(_, decoration, inst, &underlying_type)) {
    return error;
  }

  const Instruction* const type_inst = _.FindDef(underlying_type);
  if (type_inst->opcode() != spv::Op::OpTypeArray) {
    return diag(GetDefinitionDesc(decoration, inst) + " is not an array.");
  }

  const uint32_t component_type = type_inst->word(2);
  if (!_.IsIntVectorType(component_type)) {
    return diag(GetDefinitionDesc(decoration, inst) + " is not an int vector.");
  }

  const uint32_t actual_num_components = _.GetDimension(component_type);
  if (_.GetDimension(component_type) != num_components) {
    std::ostringstream ss;
    ss << GetDefinitionDesc(decoration, inst) << " has "
       << actual_num_components << " components.";
    return diag(ss.str());
  }

  const uint32_t bit_width = _.GetBitWidth(component_type);
  if (bit_width != 32) {
    std::ostringstream ss;
    ss << GetDefinitionDesc(decoration, inst)
       << " has components with bit width " << bit_width << ".";
    return diag(ss.str());
  }

  return SPV_SUCCESS;
}